

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O1

Aig_Man_t * Dar_ManChoiceNew(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  char *__dest_00;
  Aig_Man_t *pAVar4;
  Gia_Man_t *p;
  Vec_Ptr_t *vPios;
  Aig_Man_t *pAVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_50;
  char *local_40;
  void *local_38;
  
  pcVar1 = pAig->pName;
  local_38 = pAig->pManTime;
  pAig->pManTime = (void *)0x0;
  if (pcVar1 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar1);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,pcVar1);
  }
  pcVar1 = pAig->pSpec;
  if (pcVar1 == (char *)0x0) {
    __dest_00 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar1);
    __dest_00 = (char *)malloc(sVar3 + 1);
    strcpy(__dest_00,pcVar1);
  }
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  pAVar4 = Aig_ManDupDfs(pAig);
  p = Dar_NewChoiceSynthesis(pAVar4,1,1,pPars->fPower,pPars->fLightSynth,pPars->fVerbose);
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  pPars->timeSynth = lVar7 + lVar6;
  if (pPars->fUseGia == 0) {
    pAVar5 = Gia_ManToAigSkip(p,3);
    local_40 = __dest_00;
    Gia_ManStop(p);
    pAVar4 = Dch_ComputeChoices(pAVar5,pPars);
    __dest_00 = local_40;
    Aig_ManStop(pAVar5);
  }
  else {
    pAVar4 = Cec_ComputeChoices(p,pPars);
  }
  vPios = Aig_ManOrderPios(pAVar4,pAig);
  Aig_ManStop(pAig);
  pAVar5 = Aig_ManDupDfsGuided(pAVar4,vPios);
  Aig_ManStop(pAVar4);
  if (vPios->pArray != (void **)0x0) {
    free(vPios->pArray);
    vPios->pArray = (void **)0x0;
  }
  if (vPios != (Vec_Ptr_t *)0x0) {
    free(vPios);
  }
  pAVar5->pManTime = local_38;
  Aig_ManChoiceLevel(pAVar5);
  if (pAVar5->pName != (char *)0x0) {
    free(pAVar5->pName);
    pAVar5->pName = (char *)0x0;
  }
  if (pAVar5->pSpec != (char *)0x0) {
    free(pAVar5->pSpec);
    pAVar5->pSpec = (char *)0x0;
  }
  pAVar5->pName = __dest;
  pAVar5->pSpec = __dest_00;
  return pAVar5;
}

Assistant:

Aig_Man_t * Dar_ManChoiceNew( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    extern Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars );
//    extern Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs );
    extern Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars );
//    int fVerbose = pPars->fVerbose;
    Aig_Man_t * pMan, * pTemp;
    Gia_Man_t * pGia;
    Vec_Ptr_t * vPios;
    void * pManTime;
    char * pName, * pSpec;
    abctime clk;

    // save useful things
    pManTime = pAig->pManTime; pAig->pManTime = NULL;
    pName = Abc_UtilStrsav( pAig->pName );
    pSpec = Abc_UtilStrsav( pAig->pSpec );

    // perform synthesis
clk = Abc_Clock();
    pGia = Dar_NewChoiceSynthesis( Aig_ManDupDfs(pAig), 1, 1, pPars->fPower, pPars->fLightSynth, pPars->fVerbose );
pPars->timeSynth = Abc_Clock() - clk;

    // perform choice computation
    if ( pPars->fUseGia )
        pMan = Cec_ComputeChoices( pGia, pPars );
    else
    {
        pMan = Gia_ManToAigSkip( pGia, 3 );
        Gia_ManStop( pGia );
        pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
        Aig_ManStop( pTemp );
    }

    // create guidence
    vPios = Aig_ManOrderPios( pMan, pAig ); 
    Aig_ManStop( pAig );

    // reconstruct the network
    pMan = Aig_ManDupDfsGuided( pTemp = pMan, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );

    // reset levels
    pMan->pManTime = pManTime;
    Aig_ManChoiceLevel( pMan );

    // copy names
    ABC_FREE( pMan->pName );
    ABC_FREE( pMan->pSpec );
    pMan->pName = pName;
    pMan->pSpec = pSpec;
    return pMan;
}